

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::tryCastToType(Value *__return_storage_ptr__,Value *this,Type *destType)

{
  undefined8 uVar1;
  Structure *o;
  bool bVar2;
  CastType CVar3;
  Type t;
  Type local_70;
  undefined1 local_58 [16];
  StructurePtr local_48;
  PackedData local_40;
  
  bVar2 = Type::isEqual(destType,&this->type,0);
  if (bVar2) {
    Value(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  CVar3 = TypeRules::getCastType(destType,&this->type);
  if (CVar3 == notPossible) {
LAB_001a1d5b:
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  else {
    if ((destType->category == array) && (destType->boundingSize == 0)) {
      uVar1._0_1_ = destType->category;
      uVar1._1_1_ = destType->arrayElementCategory;
      uVar1._2_1_ = destType->isRef;
      uVar1._3_1_ = destType->isConstant;
      uVar1._4_4_ = destType->primitiveType;
      local_58._8_8_ = *(undefined8 *)&destType->boundingSize;
      o = (destType->structure).object;
      if (o != (Structure *)0x0) {
        (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
      }
      local_58._0_3_ = (undefined3)uVar1;
      local_58[3] = 0;
      local_58._4_4_ = uVar1._4_4_;
      local_48.object = o;
      bVar2 = Type::isEqual((Type *)local_58,&this->type,0);
      RefCountedPtr<soul::Structure>::decIfNotNull(o);
      if (!bVar2) goto LAB_001a1d5b;
    }
    local_70.category = destType->category;
    local_70.arrayElementCategory = destType->arrayElementCategory;
    local_70.isRef = destType->isRef;
    local_70.isConstant = destType->isConstant;
    local_70.primitiveType.type = (destType->primitiveType).type;
    local_70.boundingSize = destType->boundingSize;
    local_70.arrayElementBoundingSize = destType->arrayElementBoundingSize;
    local_70.structure.object = (destType->structure).object;
    if (local_70.structure.object != (Structure *)0x0) {
      ((local_70.structure.object)->super_RefCountedObject).refCount =
           ((local_70.structure.object)->super_RefCountedObject).refCount + 1;
    }
    Value(__return_storage_ptr__,&local_70);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_70.structure.object);
    getData((PackedData *)local_58,__return_storage_ptr__);
    getData(&local_40,this);
    PackedData::setFrom((PackedData *)local_58,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType) const
{
    if (destType.isIdentical (type))
        return *this;

    if (! TypeRules::canCastTo (destType, type))
        return {};

    if (destType.isUnsizedArray()
          && ! destType.removeConstIfPresent().isIdentical (type))
        return {};

    Value v (destType);
    v.getData().setFrom (getData());
    return v;
}